

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

void __thiscall BinaryOperator::~BinaryOperator(BinaryOperator *this)

{
  BinaryOperator *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR___cxa_pure_virtual_0012da90;
  if ((this->left == (Expression *)0x0) && (this->left != (Expression *)0x0)) {
    (*this->left->_vptr_Expression[2])();
  }
  this->left = (Expression *)0x0;
  if ((this->right == (Expression *)0x0) && (this->right != (Expression *)0x0)) {
    (*this->right->_vptr_Expression[2])();
  }
  this->right = (Expression *)0x0;
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

BinaryOperator::~BinaryOperator() {
  if (this->left == nullptr) {
    delete this->left;
  }
  this->left = nullptr;
  if (this->right == nullptr) {
    delete this->right;
  }
  this->right = nullptr;
}